

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::
    get_dynamic_spec<fmt::v9::detail::width_checker,fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,fmt::v9::detail::error_handler>
              (void)

{
  int iStack0000000000000008;
  long in_stack_00000010;
  undefined4 in_stack_00000018;
  error_handler local_9;
  width_checker<fmt::v9::detail::error_handler> local_8;
  
  local_8.handler_ = &local_9;
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 =
         width_checker<fmt::v9::detail::error_handler>::operator()<int,_0>
                   (&local_8,iStack0000000000000008);
    break;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    break;
  case 3:
    _iStack0000000000000008 =
         width_checker<fmt::v9::detail::error_handler>::operator()<long_long,_0>
                   (&local_8,_iStack0000000000000008);
    break;
  case 5:
    if (in_stack_00000010 < 0) {
      throw_format_error("negative width");
    }
  case 4:
  case 6:
    break;
  default:
    throw_format_error("width is not integer");
  }
  if (_iStack0000000000000008 >> 0x1f == 0) {
    return (int)_iStack0000000000000008;
  }
  throw_format_error("number is too big");
}

Assistant:

FMT_CONSTEXPR auto get_dynamic_spec(FormatArg arg, ErrorHandler eh) -> int {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}